

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_tree_state_pop(nk_context *ctx)

{
  int *piVar1;
  float fVar2;
  nk_panel *pnVar3;
  
  if (((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) &&
     (pnVar3 = ctx->current->layout, pnVar3 != (nk_panel *)0x0)) {
    fVar2 = (ctx->style).tab.indent;
    pnVar3->at_x = pnVar3->at_x - ((float)*pnVar3->offset_x + fVar2);
    (pnVar3->bounds).w = fVar2 + (ctx->style).window.padding.x + (pnVar3->bounds).w;
    piVar1 = &(pnVar3->row).tree_depth;
    *piVar1 = *piVar1 + -1;
  }
  return;
}

Assistant:

NK_API void
nk_tree_state_pop(struct nk_context *ctx)
{
struct nk_window *win = 0;
struct nk_panel *layout = 0;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return;

win = ctx->current;
layout = win->layout;
layout->at_x -= ctx->style.tab.indent + (float)*layout->offset_x;
layout->bounds.w += ctx->style.tab.indent + ctx->style.window.padding.x;
NK_ASSERT(layout->row.tree_depth);
layout->row.tree_depth--;
}